

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_date_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  uint32_t *puVar1;
  anon_class_32_2_842af841 *paVar2;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_00;
  long *plVar3;
  function_object *pfVar4;
  void *pvVar5;
  gc_heap_ptr_untyped *this;
  long *plVar6;
  undefined1 local_188 [16];
  string_view local_178;
  gc_heap_ptr_untyped local_168;
  gc_heap_ptr_untyped local_158;
  anon_class_24_3_cfd939b3 make_date_mutator;
  string_view local_130;
  string_view local_120;
  value p;
  gc_heap_ptr<mjs::date_object> prototype;
  undefined1 local_d0 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_c8;
  anon_class_32_2_842af841 get_data_object;
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr<mjs::function_object> c;
  anon_class_16_2_4c7e7635 make_simple_date_mutator;
  anon_class_16_2_9fb1826f copy_func;
  anon_class_16_1_f1e7abc2 new_date;
  
  h = (global->super_gc_heap_ptr_untyped).heap_;
  local_d0 = (undefined1  [8])0x4;
  local_c8.n_ = (double)((long)"getUTCDate" + 6);
  string::string((string *)&p,h,(string_view *)local_d0);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x58))(&get_data_object,plVar3);
  make_date_mutator.get_data_object =
       (anon_class_32_2_842af841 *)CONCAT44(make_date_mutator.get_data_object._4_4_,0x7fc00000);
  gc_heap::make<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,float>
            ((gc_heap *)&prototype,(string *)h,(gc_heap_ptr<mjs::object> *)&p,
             (float *)&get_data_object);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&new_date,&prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&p,&prototype.super_gc_heap_ptr_untyped);
  puVar1 = &p.field_1.o_.super_gc_heap_ptr_untyped.pos_;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)puVar1,(gc_heap_ptr_untyped *)&new_date);
  gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
  object::class_name((object *)&make_date_mutator);
  make_raw_function((mjs *)&c,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  get_data_object.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  get_data_object.global.super_gc_heap_ptr_untyped.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8d78;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x20),(gc_heap_ptr_untyped *)puVar1);
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
             (gc_heap_ptr<mjs::gc_string> *)&make_date_mutator,
             (gc_heap_ptr<mjs::gc_string> *)&get_data_object,7);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_26::~__26((__26 *)&p);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)local_188,(gc_heap_ptr_untyped *)&new_date);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8db8;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),(gc_heap_ptr_untyped *)local_188);
  function_object::construct_function(pfVar4,(gc_heap_ptr<mjs::gc_function> *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  function_object::get_prototype(&p,pfVar4);
  if (p.type_ == object) {
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar5 + 0x20) < 1) {
      this = &value::object_value(&p)->super_gc_heap_ptr_untyped;
      plVar3 = (long *)gc_heap_ptr_untyped::get(this);
      plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x98))(&get_data_object,plVar6,"constructor");
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&make_date_mutator,&c.super_gc_heap_ptr_untyped);
      value::value((value *)local_d0,(object_ptr *)&make_date_mutator);
      (**(code **)(*plVar3 + 8))(plVar3,&get_data_object,local_d0,2);
      value::~value((value *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
    }
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(local_d0,plVar6,"constructor");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&get_data_object,&c.super_gc_heap_ptr_untyped);
    value::value(&p,(object_ptr *)&get_data_object);
    (**(code **)(*plVar3 + 8))(plVar3,local_d0,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_168,&c.super_gc_heap_ptr_untyped);
    local_178._M_len = 5;
    local_178._M_str = "parse";
    string::string((string *)&local_158,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)(local_188 + 0x10));
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_168);
    make_raw_function((mjs *)local_188,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    get_data_object.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    get_data_object.global.super_gc_heap_ptr_untyped.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8df8;
    *(gc_heap **)((long)pvVar5 + 0x10) = h;
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_158,
               (gc_heap_ptr<mjs::gc_string> *)&get_data_object,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&make_date_mutator,(gc_heap_ptr_untyped *)local_188);
    value::value(&p,(object_ptr *)&make_date_mutator);
    (**(code **)(*plVar3 + 8))(plVar3,&local_158,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_168,&c.super_gc_heap_ptr_untyped);
    local_178._M_len = 3;
    local_178._M_str = "UTC";
    string::string((string *)&local_158,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)(local_188 + 0x10));
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_168);
    make_raw_function((mjs *)local_188,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    get_data_object.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    get_data_object.global.super_gc_heap_ptr_untyped.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8e38;
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
               (gc_heap_ptr<mjs::gc_string> *)&local_158,
               (gc_heap_ptr<mjs::gc_string> *)&get_data_object,7);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_data_object);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&make_date_mutator,(gc_heap_ptr_untyped *)local_188);
    value::value(&p,(object_ptr *)&make_date_mutator);
    (**(code **)(*plVar3 + 8))(plVar3,&local_158,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&get_data_object,&global->super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&get_data_object.prototype.super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 7;
    local_120._M_str = "valueOf";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d87b8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 7;
    local_120._M_str = "getTime";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d87f8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 7;
    local_120._M_str = "getYear";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8838;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xb;
    local_120._M_str = "getFullYear";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8878;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xe;
    local_120._M_str = "getUTCFullYear";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d88b8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 8;
    local_120._M_str = "getMonth";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d88f8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xb;
    local_120._M_str = "getUTCMonth";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8938;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 7;
    local_120._M_str = "getDate";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8978;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 10;
    local_120._M_str = "getUTCDate";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d89b8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 6;
    local_120._M_str = "getDay";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d89f8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 9;
    local_120._M_str = "getUTCDay";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8a38;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 8;
    local_120._M_str = "getHours";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8a78;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xb;
    local_120._M_str = "getUTCHours";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8ab8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 10;
    local_120._M_str = "getMinutes";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8af8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xd;
    local_120._M_str = "getUTCMinutes";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8b38;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 10;
    local_120._M_str = "getSeconds";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8b78;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xd;
    local_120._M_str = "getUTCSeconds";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8bb8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0xf;
    local_120._M_str = "getMilliseconds";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8bf8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,&get_data_object);
    local_120._M_len = 0x12;
    local_120._M_str = "getUTCMilliseconds";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8c38;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)(local_d0 + 8),&get_data_object);
    local_120._M_len = 0x11;
    local_120._M_str = "getTimezoneOffset";
    string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
    make_raw_function((mjs *)(local_188 + 0x10),global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
    local_188._0_8_ = (gc_heap *)0x0;
    local_188._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&make_date_mutator,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&make_date_mutator);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8c78;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),(anon_class_32_2_842af841 *)(local_d0 + 8));
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&make_date_mutator,
               (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&make_date_mutator);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10));
    value::value(&p,(object_ptr *)&local_158);
    (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30
              ((__30 *)(local_d0 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    make_simple_date_mutator.copy_func = &copy_func;
    make_date_mutator.get_data_object = &get_data_object;
    make_date_mutator.global = global;
    make_date_mutator.prototype =
         (gc_heap_ptr<mjs::date_object> *)&prototype.super_gc_heap_ptr_untyped;
    make_simple_date_mutator.make_date_mutator = &make_date_mutator;
    copy_func.prototype = (gc_heap_ptr<mjs::date_object> *)&prototype.super_gc_heap_ptr_untyped;
    copy_func.h = h;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&prototype.super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,make_date_mutator.get_data_object);
    local_130._M_len = 7;
    local_130._M_str = "setTime";
    string::string((string *)&local_120,(global->super_gc_heap_ptr_untyped).heap_,&local_130);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
    make_raw_function((mjs *)&local_168,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
    local_158.heap_ = (gc_heap *)0x0;
    local_158.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8cb8;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
               (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158,0
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168);
    value::value(&p,(object_ptr *)(local_188 + 0x10));
    (**(code **)(*plVar3 + 8))(plVar3,&local_120,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setMilliseconds",0x30,0xffffffffffffffff,
               0xffffffffffffffff,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setSeconds",0x28,0x30,0xffffffffffffffff,
               0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setMinutes",0x20,0x28,0x30,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setHours",0x18,0x20,0x28,0x30);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setDate",0x10,0xffffffffffffffff,0xffffffffffffffff,
               0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setMonth",8,0x10,0xffffffffffffffff,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&make_simple_date_mutator,"setFullYear",0,8,0x10,0xffffffffffffffff);
    global_00 = make_date_mutator.global;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&local_88,&(make_date_mutator.prototype)->super_gc_heap_ptr_untyped);
    paVar2 = (anon_class_32_2_842af841 *)(local_d0 + 8);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)paVar2,make_date_mutator.get_data_object);
    local_130._M_len = 7;
    local_130._M_str = "setYear";
    string::string((string *)&local_120,(global_00->super_gc_heap_ptr_untyped).heap_,&local_130);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
    make_raw_function((mjs *)&local_168,global_00);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
    local_158.heap_ = (gc_heap *)0x0;
    local_158.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8d38;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x18),paVar2);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
               (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158,0
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168);
    value::value(&p,(object_ptr *)(local_188 + 0x10));
    (**(code **)(*plVar3 + 8))(plVar3,&local_120,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)paVar2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&prototype.super_gc_heap_ptr_untyped);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)local_d0,&get_data_object);
    local_130._M_len = 8;
    local_130._M_str = "toString";
    string::string((string *)&local_120,(global->super_gc_heap_ptr_untyped).heap_,&local_130);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
    make_raw_function((mjs *)&local_168,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
    local_158.heap_ = (gc_heap *)0x0;
    local_158.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8e78;
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
              ((__30 *)((long)pvVar5 + 0x10),(anon_class_32_2_842af841 *)local_d0);
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
               (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158,0
              );
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168);
    value::value(&p,(object_ptr *)(local_188 + 0x10));
    (**(code **)(*plVar3 + 8))(plVar3,&local_120,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    make_date_object::anon_class_16_2_9fb1826f::operator()(&copy_func,L"toString",L"toLocaleString")
    ;
    make_date_object::anon_class_16_2_9fb1826f::operator()(&copy_func,L"toString",L"toUTCString");
    make_date_object::anon_class_16_2_9fb1826f::operator()(&copy_func,L"toString",L"toGMTString");
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar5 + 0x20)) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&prototype.super_gc_heap_ptr_untyped);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)local_d0,&get_data_object);
      local_130._M_len = 0xc;
      local_130._M_str = "toTimeString";
      string::string((string *)&local_120,(global->super_gc_heap_ptr_untyped).heap_,&local_130);
      plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
      make_raw_function((mjs *)&local_168,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8eb8;
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)((long)pvVar5 + 0x10),(anon_class_32_2_842af841 *)local_d0);
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168)
      ;
      value::value(&p,(object_ptr *)(local_188 + 0x10));
      (**(code **)(*plVar3 + 8))(plVar3,&local_120,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&prototype.super_gc_heap_ptr_untyped);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)local_d0,&get_data_object);
      local_130._M_len = 0xc;
      local_130._M_str = "toDateString";
      string::string((string *)&local_120,(global->super_gc_heap_ptr_untyped).heap_,&local_130);
      plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
      make_raw_function((mjs *)&local_168,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8ef8;
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)((long)pvVar5 + 0x10),(anon_class_32_2_842af841 *)local_d0);
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168)
      ;
      value::value(&p,(object_ptr *)(local_188 + 0x10));
      (**(code **)(*plVar3 + 8))(plVar3,&local_120,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      make_date_object::anon_class_16_2_9fb1826f::operator()
                (&copy_func,L"toTimeString",L"toLocaleTimeString");
      make_date_object::anon_class_16_2_9fb1826f::operator()
                (&copy_func,L"toDateString",L"toLocaleDateString");
    }
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (1 < *(int *)((long)pvVar5 + 0x20)) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_130,&c.super_gc_heap_ptr_untyped);
      local_120._M_len = 3;
      local_120._M_str = "now";
      string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
      make_raw_function((mjs *)(local_188 + 0x10),global);
      pfVar4 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
      local_188._0_8_ = (gc_heap *)0x0;
      local_188._8_4_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8f38;
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,
                 0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10))
      ;
      value::value(&p,(object_ptr *)&local_158);
      (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&prototype.super_gc_heap_ptr_untyped);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)&p,&get_data_object);
      puVar1 = &p.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)puVar1,&global->super_gc_heap_ptr_untyped);
      local_130._M_len = 0xb;
      local_130._M_str = "toISOString";
      string::string((string *)&local_120,(global->super_gc_heap_ptr_untyped).heap_,&local_130);
      plVar3 = (long *)gc_heap_ptr_untyped::get(&local_88);
      make_raw_function((mjs *)&local_168,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_168);
      local_158.heap_ = (gc_heap *)0x0;
      local_158.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_188,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_188);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8f78;
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
                ((__30 *)((long)pvVar5 + 0x10),(anon_class_32_2_842af841 *)&p);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x30),(gc_heap_ptr_untyped *)puVar1);
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_188,
                 (gc_heap_ptr<mjs::gc_string> *)&local_120,(gc_heap_ptr<mjs::gc_string> *)&local_158
                 ,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10),&local_168)
      ;
      value::value((value *)local_d0,(object_ptr *)(local_188 + 0x10));
      (**(code **)(*plVar3 + 8))(plVar3,&local_120,local_d0,2);
      value::~value((value *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
      make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_36::~__36((__36 *)&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_130,&prototype.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_88,&global->super_gc_heap_ptr_untyped);
      local_120._M_len = 6;
      local_120._M_str = "toJSON";
      string::string((string *)&local_168,(global->super_gc_heap_ptr_untyped).heap_,&local_120);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_130);
      make_raw_function((mjs *)(local_188 + 0x10),global);
      pfVar4 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_188 + 0x10));
      local_188._0_8_ = (gc_heap *)0x0;
      local_188._8_4_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_d0,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8fb8;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar5 + 0x10),&local_88);
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_d0,
                 (gc_heap_ptr<mjs::gc_string> *)&local_168,(gc_heap_ptr<mjs::gc_string> *)local_188,
                 1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_188);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_158,(gc_heap_ptr_untyped *)(local_188 + 0x10))
      ;
      value::value(&p,(object_ptr *)&local_158);
      (**(code **)(*plVar3 + 8))(plVar3,&local_168,&p,2);
      value::~value(&p);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_158);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_188 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_130);
    }
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)__return_storage_ptr__,&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30
              ((__30 *)&get_data_object);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&new_date);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:310:35)]"
               );
}

Assistant:

global_object_create_result make_date_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();

    auto prototype = h.make<date_object>(string{h, "Date"}, global->object_prototype(), NAN);

    auto new_date = [prototype](double val) {
        return prototype.heap().make<date_object>(prototype->class_name(), prototype, val);
    };

    auto c = make_function(global, [prototype, new_date](const value&, const std::vector<value>&) {
        // Equivalent to (new Date()).toString()
        return value{to_string(prototype.heap(), value{new_date(date_helper::current_time_utc())})};
    }, prototype->class_name().unsafe_raw_get(), 7);
    make_constructable(global, c, [new_date](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            return value{new_date(date_helper::current_time_utc())};
        } else if (args.size() == 1) {
            auto v = to_primitive(args[0]);
            if (v.type() == value_type::string) {
                // return Date.parse(v)
                return value{new_date(date_helper::parse(v.string_value().view()))};
            }
            return value{new_date(to_number(v))};
        } else if (args.size() == 2) {
            NOT_IMPLEMENTED("new Date(value)");
        }
        return value{date_helper::time_clip(date_helper::utc(date_helper::time_from_args(args)))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, "parse", [&h](const value&, const std::vector<value>& args) {
        if (!args.empty()) {
            const auto s = to_string(h, args.front());
            return value{date_helper::parse(s.view())};
        }
        return value{NAN};
    }, 1);
    put_native_function(global, c, "UTC", [](const value&, const std::vector<value>& args) {
        if (args.size() < 3) {
            NOT_IMPLEMENTED("Date.UTC() with less than 3 arguments");
        }
        return value{date_helper::time_clip(date_helper::time_from_args(args))};
    }, 7);

    auto get_data_object = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Date");
        return gc_heap_ptr<date_object>{this_.object_value()};
    };

    auto make_date_getter = [&](const char* name, auto f) {
        put_native_function(global, prototype, name ,[f, get_data_object](const value& this_, const std::vector<value>&) {
            const double t = get_data_object(this_)->date_value();
            if (std::isnan(t)) {
                return value{t};
            }
            return value{static_cast<double>(f(t))};
        }, 0);
    };
    make_date_getter("valueOf", [](double t) { return t; });
    make_date_getter("getTime", [](double t) { return t; });
    make_date_getter("getYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t)) - 1900;
    });
    make_date_getter("getFullYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCFullYear", [](double t) {
        return date_helper::year_from_time(t);
    });
    make_date_getter("getMonth", [](double t) {
        return date_helper::month_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMonth", [](double t) {
        return date_helper::month_from_time(t);
    });
    make_date_getter("getDate", [](double t) {
        return date_helper::date_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCDate", [](double t) {
        return date_helper::date_from_time(t);
    });
    make_date_getter("getDay", [](double t) {
        return date_helper::week_day(date_helper::local_time(t));
    });
    make_date_getter("getUTCDay", [](double t) {
        return date_helper::week_day(t);
    });
    make_date_getter("getHours", [](double t) {
        return date_helper::hour_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCHours", [](double t) {
        return date_helper::hour_from_time(t);
    });
    make_date_getter("getMinutes", [](double t) {
        return date_helper::min_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMinutes", [](double t) {
        return date_helper::min_from_time(t);
    });
    make_date_getter("getSeconds", [](double t) {
        return date_helper::sec_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCSeconds", [](double t) {
        return date_helper::sec_from_time(t);
    });
    make_date_getter("getMilliseconds", [](double t) {
        return date_helper::ms_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMilliseconds", [](double t) {
        return date_helper::ms_from_time(t);
    });
    make_date_getter("getTimezoneOffset", [](double t) {
        return (t - date_helper::local_time(t)) / date_helper::ms_per_minute;
    });

    auto make_date_mutator = [&](const char* name, auto f) {
        put_native_function(global, prototype, name, [f, get_data_object](const value& this_, const std::vector<value>& args) {
            auto d = get_data_object(this_);
            const auto v = f(d->date_value(), !args.empty() ? to_number(args[0]) : NAN, args);
            d->date_value(v);
            return value{v};
        }, 0);
    };

    auto copy_func = [&](const wchar_t* from, const wchar_t* to) {
        prototype->put(string{h, to}, prototype->get(from), prototype->own_property_attributes(from));
    };

    using field_ptr = double date_time::*;

    auto make_simple_date_mutator = [&](const char* name, field_ptr field0, field_ptr field1 = nullptr, field_ptr field2 = nullptr, field_ptr field3 = nullptr) {
        make_date_mutator(name, [field0, field1, field2, field3](double current, double arg, const std::vector<value>& args) {
            auto dt = date_helper::date_time_from_time(current);
            dt.*field0 = arg;
            if (field1 && args.size() > 1) dt.*field1 = to_number(args[1]);
            if (field2 && args.size() > 2) dt.*field2 = to_number(args[2]);
            if (field3 && args.size() > 3) dt.*field3 = to_number(args[3]);
            return date_helper::time_from_date_time(dt);
        });
        const std::wstring from{name, name+std::strlen(name)};
        assert(from.compare(0, 3, L"set") == 0);
        copy_func(from.c_str(), (L"setUTC" + from.substr(3)).c_str());
    };

    make_date_mutator("setTime", [](double, double arg, const std::vector<value>&) {
        return arg;
    });

    make_simple_date_mutator("setMilliseconds", &date_time::ms);
    make_simple_date_mutator("setSeconds", &date_time::s, &date_time::ms);
    make_simple_date_mutator("setMinutes", &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setHours", &date_time::h, &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setDate", &date_time::day);
    make_simple_date_mutator("setMonth", &date_time::month, &date_time::day);
    make_simple_date_mutator("setFullYear", &date_time::year, &date_time::month, &date_time::day);

    make_date_mutator("setYear", [](double current, double arg, const std::vector<value>&) {
        auto dt = date_helper::date_time_from_time(current);
        dt.year = arg + 1900;
        return date_helper::time_from_date_time(dt);
    });

    put_native_function(global, prototype, "toString", [get_data_object](const value& this_, const std::vector<value>&) {
        auto o = get_data_object(this_);
        return value{date_helper::to_string(o.heap(), o->date_value())};
    }, 0);

    copy_func(L"toString", L"toLocaleString");
    copy_func(L"toString", L"toUTCString");
    copy_func(L"toString", L"toGMTString");

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "toTimeString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_time_string(o.heap(), o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toDateString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_date_string(o.heap(), o->date_value())};
        }, 0);

        copy_func(L"toTimeString", L"toLocaleTimeString");
        copy_func(L"toDateString", L"toLocaleDateString");
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, c, "now", [](const value&, const std::vector<value>&) {
            return value{date_helper::current_time_utc()};
        }, 0);

        put_native_function(global, prototype, "toISOString", [get_data_object, global](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_iso_string(global, o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toJSON", [global](const value& this_, const std::vector<value>&) {
            return date_helper::to_json(global, this_);
        }, 1);
    }

    return { c, prototype };
}